

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O0

ZyanStatus
ZydisFormatterIntelPrintRegister
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context,
          ZydisRegister reg)

{
  ZydisShortString *source;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisShortString *str;
  ZydisRegister reg_local;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x138,
                  "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  if (buffer != (ZydisFormatterBuffer *)0x0) {
    if (context != (ZydisFormatterContext *)0x0) {
      source = ZydisRegisterGetStringWrapped(reg);
      if (source == (ZydisShortString *)0x0) {
        if (buffer->is_token_list == '\0') {
          formatter_local._4_4_ =
               ZydisStringAppendShortCase
                         (&buffer->string,&STR_INVALID_REG,formatter->case_registers);
        }
        else {
          formatter_local._4_4_ =
               ZydisFormatterBufferAppendPredefined
                         (buffer,(ZydisPredefinedToken *)&TOK_DATA_INVALID_REG);
        }
        if ((formatter_local._4_4_ & 0x80000000) == 0) {
          formatter_local._4_4_ = 0x100000;
        }
      }
      else if ((buffer->is_token_list == '\0') ||
              (formatter_local._4_4_ = ZydisFormatterBufferAppend(buffer,'\a'),
              (formatter_local._4_4_ & 0x80000000) == 0)) {
        formatter_local._4_4_ =
             ZydisStringAppendShortCase(&buffer->string,source,formatter->case_registers);
      }
      return formatter_local._4_4_;
    }
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x13a,
                  "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
                 );
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                ,0x139,
                "ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *, ZydisRegister)"
               );
}

Assistant:

ZyanStatus ZydisFormatterIntelPrintRegister(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context, ZydisRegister reg)
{
    ZYAN_UNUSED(context);

    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    const ZydisShortString* str = ZydisRegisterGetStringWrapped(reg);
    if (!str)
    {
        ZYDIS_BUFFER_APPEND_CASE(buffer, INVALID_REG, formatter->case_registers);
        return ZYAN_STATUS_SUCCESS;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_REGISTER);
    return ZydisStringAppendShortCase(&buffer->string, str, formatter->case_registers);
}